

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

cmList * __thiscall cmList::filter(cmList *this,string_view pattern,FilterMode mode)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  invalid_argument *this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  long lVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long lVar5;
  undefined1 local_2a0 [32];
  _Iter_pred<(anonymous_namespace)::MatchesRegex> local_280;
  string_view pattern_local;
  RegularExpression regex;
  
  pattern_local._M_str = pattern._M_str;
  pattern_local._M_len = pattern._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_2a0,&pattern_local,(allocator<char> *)&local_280);
  cmsys::RegularExpression::RegularExpression(&regex,(string *)local_2a0);
  std::__cxx11::string::~string((string *)local_2a0);
  if (regex.program == (char *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    cmStrCat<char_const(&)[57],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>
              ((string *)local_2a0,
               (char (*) [57])"sub-command FILTER, mode REGEX failed to compile regex \"",
               &pattern_local,(char (*) [3])0x6b36dc);
    std::invalid_argument::invalid_argument(this_00,(string *)local_2a0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  _Var4._M_current =
       (this->Values).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2a0[8] = mode == INCLUDE;
  lVar5 = (long)pbVar1 - (long)_Var4._M_current;
  local_2a0._0_8_ = &regex;
  local_280._M_pred.Regex = &regex;
  local_280._M_pred.IncludeMatches = local_2a0[8];
  for (lVar3 = lVar5 >> 7; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                      ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)local_2a0,_Var4);
    __first._M_current = _Var4._M_current;
    if (bVar2) goto LAB_001882ed;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                      ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)local_2a0,
                       _Var4._M_current + 1);
    __first._M_current = _Var4._M_current + 1;
    if (bVar2) goto LAB_001882ed;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                      ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)local_2a0,
                       _Var4._M_current + 2);
    __first._M_current = _Var4._M_current + 2;
    if (bVar2) goto LAB_001882ed;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                      ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)local_2a0,
                       _Var4._M_current + 3);
    __first._M_current = _Var4._M_current + 3;
    if (bVar2) goto LAB_001882ed;
    _Var4._M_current = _Var4._M_current + 4;
    lVar5 = lVar5 + -0x80;
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 == 1) {
LAB_00188378:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                      ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)local_2a0,_Var4);
    __first._M_current = _Var4._M_current;
    if (!bVar2) {
      __first._M_current = pbVar1;
    }
  }
  else if (lVar5 == 2) {
LAB_0018835d:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                      ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)local_2a0,_Var4);
    __first._M_current = _Var4._M_current;
    if (!bVar2) {
      _Var4._M_current = _Var4._M_current + 1;
      goto LAB_00188378;
    }
  }
  else {
    __first._M_current = pbVar1;
    if (lVar5 != 3) goto LAB_0018832b;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                      ((_Iter_pred<(anonymous_namespace)::MatchesRegex> *)local_2a0,_Var4);
    __first._M_current = _Var4._M_current;
    if (!bVar2) {
      _Var4._M_current = _Var4._M_current + 1;
      goto LAB_0018835d;
    }
  }
LAB_001882ed:
  if (__first._M_current != pbVar1) {
    _Var4._M_current = __first._M_current;
    while (_Var4._M_current = _Var4._M_current + 1, _Var4._M_current != pbVar1) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::MatchesRegex>::operator()
                        (&local_280,_Var4);
      if (!bVar2) {
        std::__cxx11::string::operator=((string *)__first._M_current,(string *)_Var4._M_current);
        __first._M_current = __first._M_current + 1;
      }
    }
  }
LAB_0018832b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&this->Values,(const_iterator)__first._M_current,
          (this->Values).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  cmsys::RegularExpression::~RegularExpression(&regex);
  return this;
}

Assistant:

cmList& cmList::filter(cm::string_view pattern, FilterMode mode)
{
  cmsys::RegularExpression regex(std::string{ pattern });
  if (!regex.is_valid()) {
    throw std::invalid_argument(
      cmStrCat("sub-command FILTER, mode REGEX failed to compile regex \"",
               pattern, "\"."));
  }

  auto it = std::remove_if(this->Values.begin(), this->Values.end(),
                           MatchesRegex{ regex, mode });
  this->Values.erase(it, this->Values.end());

  return *this;
}